

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd_common.h
# Opt level: O1

float_type
b(uintmax_t dist_from_border,uintmax_t CPML_region_width,float_type dt,float_type alpha_max,
 float_type sigma_max)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined8 in_XMM1_Qb;
  undefined1 auVar13 [16];
  undefined8 in_XMM2_Qb;
  undefined1 in_XMM3 [16];
  undefined8 local_18;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = dt;
  auVar1._8_8_ = 0x8000000000000000;
  auVar1._0_8_ = 0x8000000000000000;
  auVar6 = vxorpd_avx512vl(auVar10._0_16_,auVar1);
  auVar1 = vcvtusi2sd_avx512f(in_XMM3,dist_from_border);
  auVar2 = vcvtusi2sd_avx512f(in_XMM3,CPML_region_width);
  dVar7 = auVar1._0_8_ / auVar2._0_8_;
  dVar8 = pow(dVar7,4.0);
  auVar11._0_8_ = pow(dVar7,4.0);
  auVar11._8_56_ = extraout_var;
  auVar3 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar11._0_16_,ZEXT816(0x3ff0000000000000));
  auVar12._0_8_ = pow(1.0 - dVar7,4.0);
  auVar12._8_56_ = extraout_var_00;
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_8_ = dVar8;
  auVar1 = vunpcklpd_avx(auVar2,auVar12._0_16_);
  auVar5._8_8_ = in_XMM2_Qb;
  auVar5._0_8_ = sigma_max;
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = alpha_max;
  auVar2 = vunpcklpd_avx(auVar5,auVar4);
  auVar9._0_8_ = auVar1._0_8_ * auVar2._0_8_;
  auVar9._8_8_ = auVar1._8_8_ * auVar2._8_8_;
  auVar13._8_8_ = 0x3da37876f14ded31;
  auVar13._0_8_ = 0x3da37876f14ded31;
  auVar1 = vmovlpd_avx(auVar13,auVar3._0_8_ * 8.85418781762039e-12);
  auVar1 = vdivpd_avx(auVar9,auVar1);
  local_18 = auVar6._0_8_;
  dVar7 = exp((auVar1._0_8_ + auVar1._8_8_) * local_18);
  return dVar7;
}

Assistant:

inline float_type b(uintmax_t dist_from_border, uintmax_t CPML_region_width,
                    float_type dt, float_type alpha_max, float_type sigma_max) {
  return exp(-dt *
             (sigma(dist_from_border, CPML_region_width, sigma_max) /
                  (eps0 * Kappa(dist_from_border, CPML_region_width)) +
              alpha(dist_from_border, CPML_region_width, alpha_max) / eps0));
}